

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

float PsiER(float *ve,float *va)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  double __x;
  double dVar5;
  float fVar6;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  uVar1 = *(undefined8 *)ve;
  local_28 = 0x3f800000;
  uVar2 = *(undefined8 *)va;
  local_38 = 0x3f800000;
  local_40 = uVar2;
  local_30 = uVar1;
  fVar3 = norm((float *)&local_40,3);
  fVar4 = norm((float *)&local_30,3);
  local_58 = (float)uVar1;
  fStack_54 = (float)((ulong)uVar1 >> 0x20);
  local_68 = (float)uVar2;
  fStack_64 = (float)((ulong)uVar2 >> 0x20);
  fVar6 = (local_68 * local_58 + fStack_54 * fStack_64 + 1.0) / (fVar3 * fVar4);
  __x = (double)fVar6;
  if (1.0 < fVar6) {
    __x = (double)(-(ulong)(__x < 1.0001) & 0x3ff0000000000000 |
                  ~-(ulong)(__x < 1.0001) & (ulong)__x);
  }
  dVar5 = acos(__x);
  fVar6 = (float)((dVar5 * 180.0) / 3.141592653589793);
  if ((fVar6 < 0.0) || (180.0 <= fVar6)) {
    local_68 = SUB84(__x,0);
    printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",(double)fVar6,local_68,
           (double)fVar3,(double)fVar4);
    printf("va=(%f,%f) ve=(%f,%f)\n",(double)*va,SUB84((double)va[1],0),(double)*ve,(double)ve[1]);
  }
  return fVar6;
}

Assistant:

float PsiER(float ve[], float va[])
{
float nva;
float nve;
float v,r;
float VE[3],VA[3];

VE[0] = ve[0];
VE[1] = ve[1];
VE[2] = 1.0;

VA[0] = va[0];
VA[1] = va[1];
VA[2] = 1.0;

nva = norm(VA,3);
nve = norm(VE,3);
v =  (VE[0]*VA[0]+VE[1]*VA[1]+1.0f)/(nva*nve);

/**  sometimes roundoff error causes problems **/
if(v>1.0 && v < 1.0001) v = 1.0;

r = (float) (acos(v)*180.0/HALF_C);

if (!(r>=0.0 && r< 180.0))
{
printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",r,v,nva,nve);
printf("va=(%f,%f) ve=(%f,%f)\n",va[0],va[1],ve[0],ve[1]);
}

return r;
}